

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForInstallTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          string *installPrefix)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  cmAlphaNum local_d0;
  undefined1 local_a0 [48];
  string local_70;
  string local_50;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)local_a0);
  bVar1 = cmMakefile::IsOn(this_00,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"INSTALL_NAME_DIR",(allocator<char> *)local_a0);
    cVar2 = GetProperty(this,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    bVar1 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_INSTALL);
    if (bVar1) {
      if (cVar2.Value != (string *)0x0) {
        if ((cVar2.Value)->_M_string_length == 0) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        cmGeneratorExpression::ReplaceInstallPrefix(__return_storage_ptr__,installPrefix);
        std::__cxx11::string::string((string *)&local_70,(string *)__return_storage_ptr__);
        local_a0._8_8_ = (char *)0x0;
        local_a0[0x10] = '\0';
        local_a0._0_8_ = local_a0 + 0x10;
        cmGeneratorExpression::Evaluate
                  ((string *)&local_d0,&local_70,this->LocalGenerator,config,
                   (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                   (cmGeneratorTarget *)0x0,(string *)local_a0);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)local_a0);
        std::__cxx11::string::~string((string *)&local_70);
        local_d0.View_._M_len = __return_storage_ptr__->_M_string_length;
        if (local_d0.View_._M_len == 0) {
          return __return_storage_ptr__;
        }
        local_d0.View_._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
        local_a0._0_8_ = &DAT_00000001;
        local_a0[0x10] = '/';
        local_a0._8_8_ = local_a0 + 0x10;
        cmStrCat<>(&local_50,&local_d0,(cmAlphaNum *)local_a0);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        return __return_storage_ptr__;
      }
    }
    else if (cVar2.Value != (string *)0x0) {
      return __return_storage_ptr__;
    }
    bVar1 = MacOSXRpathInstallNameDirDefault(this);
    if (bVar1) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForInstallTree(
  const std::string& config, const std::string& installPrefix) const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    std::string dir;
    cmValue install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_INSTALL)) {
      if (cmNonempty(install_name_dir)) {
        dir = *install_name_dir;
        cmGeneratorExpression::ReplaceInstallPrefix(dir, installPrefix);
        dir =
          cmGeneratorExpression::Evaluate(dir, this->LocalGenerator, config);
        if (!dir.empty()) {
          dir = cmStrCat(dir, '/');
        }
      }
    }
    if (!install_name_dir) {
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath/";
      }
    }
    return dir;
  }
  return "";
}